

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_intersection(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int min;
  uint16_t local_50;
  short local_48;
  int32_t earliestend;
  int32_t lateststart;
  int32_t xend;
  int32_t xstart;
  int32_t end;
  int32_t start;
  int32_t xrlepos;
  int32_t rlepos;
  int32_t neededcapacity;
  _Bool if2;
  _Bool if1;
  run_container_t *dst_local;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var2 = run_container_is_full(src_1);
  _Var3 = run_container_is_full(src_2);
  if ((_Var2) || (_Var3)) {
    if (_Var2) {
      run_container_copy(src_2,dst);
      return;
    }
    if (_Var3) {
      run_container_copy(src_1,dst);
      return;
    }
  }
  min = src_1->n_runs + src_2->n_runs;
  if (dst->capacity < min) {
    run_container_grow(dst,min,false);
  }
  dst->n_runs = 0;
  start = 0;
  end = 0;
  xstart = (int32_t)src_1->runs->value;
  xend = xstart + (uint)src_1->runs->length + 1;
  lateststart = (int32_t)src_2->runs->value;
  earliestend = lateststart + (uint)src_2->runs->length + 1;
  while( true ) {
    bVar1 = false;
    if (start < src_1->n_runs) {
      bVar1 = end < src_2->n_runs;
    }
    if (!bVar1) break;
    if ((uint)lateststart < (uint)xend) {
      if ((uint)xstart < (uint)earliestend) {
        if ((uint)lateststart < (uint)xstart) {
          local_50 = (uint16_t)xstart;
        }
        else {
          local_50 = (uint16_t)lateststart;
        }
        local_48 = (short)xend;
        if (xend == earliestend) {
          start = start + 1;
          end = end + 1;
          if (start < src_1->n_runs) {
            xstart = (int32_t)src_1->runs[start].value;
            xend = xstart + (uint)src_1->runs[start].length + 1;
          }
          if (end < src_2->n_runs) {
            lateststart = (int32_t)src_2->runs[end].value;
            earliestend = lateststart + (uint)src_2->runs[end].length + 1;
          }
        }
        else if ((uint)xend < (uint)earliestend) {
          start = start + 1;
          if (start < src_1->n_runs) {
            xstart = (int32_t)src_1->runs[start].value;
            xend = xstart + (uint)src_1->runs[start].length + 1;
          }
        }
        else {
          local_48 = (short)earliestend;
          end = end + 1;
          if (end < src_2->n_runs) {
            lateststart = (int32_t)src_2->runs[end].value;
            earliestend = lateststart + (uint)src_2->runs[end].length + 1;
          }
        }
        dst->runs[dst->n_runs].value = local_50;
        dst->runs[dst->n_runs].length = (local_48 - local_50) - 1;
        dst->n_runs = dst->n_runs + 1;
      }
      else {
        end = end + 1;
        if (end < src_2->n_runs) {
          lateststart = (int32_t)src_2->runs[end].value;
          earliestend = lateststart + (uint)src_2->runs[end].length + 1;
        }
      }
    }
    else {
      start = start + 1;
      if (start < src_1->n_runs) {
        xstart = (int32_t)src_1->runs[start].value;
        xend = xstart + (uint)src_1->runs[start].length + 1;
      }
    }
  }
  return;
}

Assistant:

void run_container_intersection(const run_container_t *src_1,
                                const run_container_t *src_2,
                                run_container_t *dst) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_2, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_1, dst);
            return;
        }
    }
    // TODO: this could be a lot more efficient, could use SIMD optimizations
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            dst->runs[dst->n_runs].value = (uint16_t)lateststart;
            dst->runs[dst->n_runs].length =
                (uint16_t)(earliestend - lateststart - 1);
            dst->n_runs++;
        }
    }
}